

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

string * __thiscall
testing::internal::
FormatForComparisonFailureMessage<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>,phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>>
          (string *__return_storage_ptr__,internal *this,
          CheckedAlloc<phmap::priv::Tracked<int>,_6> *value,
          CheckedAlloc<phmap::priv::Tracked<int>,_6> *param_2)

{
  CheckedAlloc<phmap::priv::Tracked<int>,_6> *param_1_local;
  CheckedAlloc<phmap::priv::Tracked<int>,_6> *value_local;
  
  FormatForComparison<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>,phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>>
  ::Format_abi_cxx11_(__return_storage_ptr__,
                      (FormatForComparison<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>,phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>>
                       *)this,value);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatForComparisonFailureMessage(const T1& value,
                                              const T2& /* other_operand */) {
  return FormatForComparison<T1, T2>::Format(value);
}